

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdGetPubkeyFromPrivkey(void *handle,char *privkey,char *wif,bool is_compressed,char **pubkey)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  allocator local_8a;
  KeyApi api;
  string key;
  string local_68;
  string local_48;
  
  cfd::Initialize();
  if (pubkey == (char **)0x0) {
    key._M_dataplus._M_p = "cfdcapi_key.cpp";
    key._M_string_length = CONCAT44(key._M_string_length._4_4_,0x4a2);
    key.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_7a1450;
    cfd::core::logger::warn<>((CfdSourceLocation *)&key,"pubkey is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&key,"Failed to parameter. pubkey is null.",(allocator *)&local_48);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&key);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(privkey);
  if (bVar1) {
    bVar1 = cfd::capi::IsEmptyString(wif);
    if (bVar1) {
      key._M_dataplus._M_p = "cfdcapi_key.cpp";
      key._M_string_length = CONCAT44(key._M_string_length._4_4_,0x4a8);
      key.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_7a1450;
      cfd::core::logger::warn<>((CfdSourceLocation *)&key,"privkey is null or empty.");
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&key,"Failed to parameter. privkey is null or empty.",
                 (allocator *)&local_48);
      cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&key);
      __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
  }
  key._M_dataplus._M_p = (pointer)&key.field_2;
  key._M_string_length = 0;
  key.field_2._M_allocated_capacity = key.field_2._M_allocated_capacity & 0xffffffffffffff00;
  bVar1 = cfd::capi::IsEmptyString(wif);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_68,privkey,&local_8a);
    cfd::api::KeyApi::GetPubkeyFromPrivkey(&local_48,&api,&local_68,is_compressed);
  }
  else {
    std::__cxx11::string::string((string *)&local_68,wif,&local_8a);
    cfd::api::KeyApi::GetPubkeyFromPrivkey(&local_48,&api,&local_68,is_compressed);
  }
  std::__cxx11::string::operator=((string *)&key,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  pcVar2 = cfd::capi::CreateString(&key);
  *pubkey = pcVar2;
  std::__cxx11::string::~string((string *)&key);
  return 0;
}

Assistant:

int CfdGetPubkeyFromPrivkey(
    void* handle, const char* privkey, const char* wif, bool is_compressed,
    char** pubkey) {
  try {
    cfd::Initialize();
    if (pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null.");
    }
    if (IsEmptyString(privkey) && IsEmptyString(wif)) {
      warn(CFD_LOG_SOURCE, "privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null or empty.");
    }

    KeyApi api;
    std::string key;
    if (!IsEmptyString(wif)) {
      key = api.GetPubkeyFromPrivkey(wif, is_compressed);
    } else {
      key = api.GetPubkeyFromPrivkey(privkey, is_compressed);
    }
    *pubkey = CreateString(key);

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}